

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

void __thiscall kj::anon_unknown_123::AsyncPipe::shutdownWrite(AsyncPipe *this)

{
  AsyncCapabilityStream *pAVar1;
  Disposer *pDVar2;
  AsyncCapabilityStream *pAVar3;
  
  pAVar1 = (this->state).ptr;
  if (pAVar1 != (AsyncCapabilityStream *)0x0) {
    (*(pAVar1->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[6])();
    return;
  }
  pAVar3 = (AsyncCapabilityStream *)operator_new(0x10);
  (pAVar3->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
       (_func_int **)&PTR_read_00622208;
  (pAVar3->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
       (_func_int **)&PTR_write_006222c8;
  pDVar2 = (this->ownState).disposer;
  pAVar1 = (this->ownState).ptr;
  (this->ownState).disposer =
       (Disposer *)
       &kj::_::HeapDisposer<kj::(anonymous_namespace)::AsyncPipe::ShutdownedWrite>::instance;
  (this->ownState).ptr = pAVar3;
  if (pAVar1 != (AsyncCapabilityStream *)0x0) {
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pAVar1->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream
                      [-2] + (long)&(pAVar1->super_AsyncIoStream).super_AsyncInputStream.
                                    _vptr_AsyncInputStream);
    pAVar3 = (this->ownState).ptr;
  }
  (this->state).ptr = pAVar3;
  return;
}

Assistant:

void shutdownWrite() override {
    KJ_IF_SOME(s, state) {
      s.shutdownWrite();
    } else {
      ownState = kj::heap<ShutdownedWrite>();
      state = *ownState;
    }